

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceGroup * __thiscall
cmMakefile::GetSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name)

{
  pointer pbVar1;
  __type _Var2;
  char *pcVar3;
  cmSourceGroup *this_00;
  ulong uVar4;
  pointer this_01;
  allocator local_51;
  string sgName;
  
  this_01 = (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    this_00 = (cmSourceGroup *)0x0;
    if (this_01 ==
        (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
        _M_impl.super__Vector_impl_data._M_finish) break;
    pcVar3 = cmSourceGroup::GetName(this_01);
    std::__cxx11::string::string((string *)&sgName,pcVar3,&local_51);
    _Var2 = std::operator==(&sgName,(name->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&sgName);
    this_00 = this_01;
    this_01 = this_01 + 1;
  } while (!_Var2);
  if (this_00 != (cmSourceGroup *)0x0) {
    uVar4 = 1;
    do {
      pbVar1 = (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(name->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4) {
        return this_00;
      }
      this_00 = cmSourceGroup::LookupChild(this_00,pbVar1[uVar4]._M_dataplus._M_p);
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (this_00 != (cmSourceGroup *)0x0);
  }
  return (cmSourceGroup *)0x0;
}

Assistant:

cmSourceGroup* cmMakefile::GetSourceGroup(
  const std::vector<std::string>& name) const
{
  cmSourceGroup* sg = CM_NULLPTR;

  // first look for source group starting with the same as the one we want
  for (std::vector<cmSourceGroup>::const_iterator sgIt =
         this->SourceGroups.begin();
       sgIt != this->SourceGroups.end(); ++sgIt) {
    std::string sgName = sgIt->GetName();
    if (sgName == name[0]) {
      sg = const_cast<cmSourceGroup*>(&(*sgIt));
      break;
    }
  }

  if (sg != CM_NULLPTR) {
    // iterate through its children to find match source group
    for (unsigned int i = 1; i < name.size(); ++i) {
      sg = sg->LookupChild(name[i].c_str());
      if (sg == CM_NULLPTR) {
        break;
      }
    }
  }
  return sg;
}